

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

uint8 * __thiscall
google::protobuf::EnumDescriptorProto::InternalSerializeWithCachedSizesToArray
          (EnumDescriptorProto *this,uint8 *target,EpsCopyOutputStream *stream)

{
  int iVar1;
  uint uVar2;
  EnumValueDescriptorProto *this_00;
  EnumOptions *this_01;
  EnumDescriptorProto_EnumReservedRange *this_02;
  string *s;
  size_t __n;
  void *pvVar3;
  uint8 *puVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  uint8 *local_40;
  uint local_34;
  
  local_34 = (this->_has_bits_).has_bits_[0];
  local_40 = target;
  if ((local_34 & 1) != 0) {
    local_40 = io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,1,(this->name_).ptr_,target);
  }
  iVar1 = (this->value_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar5 = 0; iVar1 != iVar5; iVar5 = iVar5 + 1) {
    io::EpsCopyOutputStream::EnsureSpace(stream,&local_40);
    this_00 = (EnumValueDescriptorProto *)
              ((this->value_).super_RepeatedPtrFieldBase.rep_)->elements[iVar5];
    *local_40 = '\x12';
    puVar4 = io::CodedOutputStream::WriteVarint32ToArray
                       ((this_00->_cached_size_).size_.super___atomic_base<int>._M_i,local_40 + 1);
    local_40 = EnumValueDescriptorProto::InternalSerializeWithCachedSizesToArray
                         (this_00,puVar4,stream);
  }
  if ((local_34 & 2) != 0) {
    io::EpsCopyOutputStream::EnsureSpace(stream,&local_40);
    this_01 = this->options_;
    *local_40 = '\x1a';
    puVar4 = io::CodedOutputStream::WriteVarint32ToArray
                       ((this_01->_cached_size_).size_.super___atomic_base<int>._M_i,local_40 + 1);
    local_40 = EnumOptions::InternalSerializeWithCachedSizesToArray(this_01,puVar4,stream);
  }
  iVar1 = (this->reserved_range_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar5 = 0; iVar1 != iVar5; iVar5 = iVar5 + 1) {
    io::EpsCopyOutputStream::EnsureSpace(stream,&local_40);
    this_02 = (EnumDescriptorProto_EnumReservedRange *)
              ((this->reserved_range_).super_RepeatedPtrFieldBase.rep_)->elements[iVar5];
    *local_40 = '\"';
    puVar4 = io::CodedOutputStream::WriteVarint32ToArray
                       ((this_02->_cached_size_).size_.super___atomic_base<int>._M_i,local_40 + 1);
    local_40 = EnumDescriptorProto_EnumReservedRange::InternalSerializeWithCachedSizesToArray
                         (this_02,puVar4,stream);
  }
  uVar2 = (this->reserved_name_).super_RepeatedPtrFieldBase.current_size_;
  uVar6 = 0;
  uVar7 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar7 = 0;
  }
  for (; puVar4 = local_40, uVar7 != uVar6; uVar6 = uVar6 + 1) {
    s = (string *)((this->reserved_name_).super_RepeatedPtrFieldBase.rep_)->elements[uVar6];
    __n = s->_M_string_length;
    if (((long)__n < 0x80) && ((long)__n <= (long)(stream->end_ + (0xe - (long)local_40)))) {
      *local_40 = '*';
      local_40[1] = (uint8)__n;
      memcpy(local_40 + 2,(s->_M_dataplus)._M_p,__n);
      local_40 = puVar4 + __n + 2;
    }
    else {
      local_40 = io::EpsCopyOutputStream::WriteStringOutline(stream,5,s,local_40);
    }
  }
  pvVar3 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar3 & 1) != 0) {
    local_40 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                         ((UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe),local_40,stream);
  }
  return local_40;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* EnumDescriptorProto::InternalSerializeWithCachedSizesToArray(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.EnumDescriptorProto)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string name = 1;
  if (cached_has_bits & 0x00000001u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_name().data(), static_cast<int>(this->_internal_name().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.EnumDescriptorProto.name");
    target = stream->WriteStringMaybeAliased(
        1, this->_internal_name(), target);
  }

  // repeated .google.protobuf.EnumValueDescriptorProto value = 2;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_value_size()); i < n; i++) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(2, this->_internal_value(i), target, stream);
  }

  // optional .google.protobuf.EnumOptions options = 3;
  if (cached_has_bits & 0x00000002u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(
        3, _Internal::options(this), target, stream);
  }

  // repeated .google.protobuf.EnumDescriptorProto.EnumReservedRange reserved_range = 4;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_reserved_range_size()); i < n; i++) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(4, this->_internal_reserved_range(i), target, stream);
  }

  // repeated string reserved_name = 5;
  for (int i = 0, n = this->_internal_reserved_name_size(); i < n; i++) {
    const auto& s = this->_internal_reserved_name(i);
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      s.data(), static_cast<int>(s.length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.EnumDescriptorProto.reserved_name");
    target = stream->WriteString(5, s, target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields(), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.EnumDescriptorProto)
  return target;
}